

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O2

void Abc_NtkBalanceAttach(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  int i;
  
  Abc_NtkCleanCopy(pNtk);
  for (i = 0; i < pNtk->vCos->nSize; i = i + 1) {
    pAVar1 = Abc_NtkCo(pNtk,i);
    pAVar1 = (Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray];
    if ((pAVar1->field_6).pTemp == (void *)0x0) {
      pAVar2 = (Abc_Obj_t *)Abc_NodeFindCone_rec(pAVar1);
      (pAVar1->field_6).pCopy = pAVar2;
    }
  }
  return;
}

Assistant:

void Abc_NtkBalanceAttach( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0(pNode);
        if ( pNode->pCopy )
            continue;
        pNode->pCopy = (Abc_Obj_t *)Abc_NodeFindCone_rec( pNode );
    }
}